

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O2

ostream * termcolor::color<(unsigned_char)128,(unsigned_char)128,(unsigned_char)128>
                    (ostream *stream)

{
  bool bVar1;
  char command [20];
  
  bVar1 = _internal::is_colorized(stream);
  if (bVar1) {
    snprintf(command,0x14,"\x1b[38;2;%d;%d;%dm",0x80,0x80,0x80);
    std::operator<<((ostream *)stream,command);
  }
  return stream;
}

Assistant:

inline std::ostream &color(std::ostream &stream) {
	if (_internal::is_colorized(stream)) {
#if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
		char command[20];
		std::snprintf(command, sizeof(command), "\033[38;2;%d;%d;%dm", r, g, b);
		stream << command;
#elif defined(TERMCOLOR_OS_WINDOWS)
#endif
	}
	return stream;
}